

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O1

double __thiscall icu_63::CalendarAstronomer::getMoonPhase(CalendarAstronomer *this)

{
  double dVar1;
  double dVar2;
  
  getMoonPosition(this);
  dVar1 = this->moonEclipLong - this->sunLongitude;
  dVar2 = uprv_floor_63(dVar1 / 6.283185307179586);
  dVar1 = cos(dVar2 * -6.283185307179586 + dVar1);
  return (1.0 - dVar1) * 0.5;
}

Assistant:

double CalendarAstronomer::getMoonPhase() {
    // See page 147 of "Practial Astronomy with your Calculator",
    // by Peter Duffet-Smith, for details on the algorithm.
    return 0.5 * (1 - cos(getMoonAge()));
}